

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::MethodDescriptorProto::MergePartialFromCodedStream
          (MethodDescriptorProto *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  string *psVar5;
  char *pcVar6;
  MethodOptions *value;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  MethodDescriptorProto *this_local;
  uint32 local_40;
  
LAB_002fca0b:
  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
    input->last_tag_ = (uint)*input->buffer_;
    io::CodedInputStream::Advance(input,1);
    local_40 = input->last_tag_;
  }
  else {
    uVar2 = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = uVar2;
    local_40 = input->last_tag_;
  }
  if (local_40 == 0) {
    return true;
  }
  iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_40);
  switch(iVar3) {
  case 1:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
    if (WVar4 != WIRETYPE_LENGTH_DELIMITED) break;
    psVar5 = mutable_name_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
    if (!bVar1) {
      return false;
    }
    name_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
LAB_002fcc35:
      psVar5 = mutable_input_type_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
      if (!bVar1) {
        return false;
      }
      input_type_abi_cxx11_(this);
      pcVar6 = (char *)std::__cxx11::string::data();
      input_type_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
LAB_002fcdad:
        psVar5 = mutable_output_type_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        output_type_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        output_type_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\"')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (bVar1) {
LAB_002fcf25:
          value = mutable_options(this);
          bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::MethodOptions>
                            (input,value);
          if (!bVar1) {
            return false;
          }
          bVar1 = io::CodedInputStream::ExpectAtEnd(input);
          if (bVar1) {
            return true;
          }
        }
      }
    }
    goto LAB_002fca0b;
  case 2:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002fcc35;
    break;
  case 3:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002fcdad;
    break;
  case 4:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002fcf25;
  }
  WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
  if (WVar4 == WIRETYPE_END_GROUP) {
    return true;
  }
  unknown_fields = mutable_unknown_fields(this);
  bVar1 = internal::WireFormat::SkipField(input,local_40,unknown_fields);
  if (!bVar1) {
    return false;
  }
  goto LAB_002fca0b;
}

Assistant:

bool MethodDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_input_type;
        break;
      }

      // optional string input_type = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_input_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_input_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->input_type().data(), this->input_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_output_type;
        break;
      }

      // optional string output_type = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_output_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_output_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->output_type().data(), this->output_type().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_options;
        break;
      }

      // optional .google.protobuf.MethodOptions options = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}